

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O1

int Gia_ManSetFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  if (pAig->vCis->nSize - pAig->nRegs != p->nPis) {
    __assert_fail("Gia_ManPiNum(pAig) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x8b,"int Gia_ManSetFailedPoCex(Gia_Man_t *, Abc_Cex_t *)");
  }
  Gia_ManCleanMark0(pAig);
  p->iPo = -1;
  if (-1 < p->iFrame) {
    uVar6 = p->nRegs;
    iVar10 = 0;
    do {
      pVVar8 = pAig->vCis;
      uVar14 = (ulong)(uint)pVVar8->nSize;
      if (pAig->nRegs < pVVar8->nSize) {
        lVar12 = 0;
        do {
          if ((int)uVar14 <= lVar12) goto LAB_0065b5f1;
          lVar13 = (long)pVVar8->pArray[lVar12];
          if ((lVar13 < 0) || (pAig->nObjs <= pVVar8->pArray[lVar12])) goto LAB_0065b5d2;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar3 + lVar13) =
               *(ulong *)(pGVar3 + lVar13) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar6 + lVar12) >> 5] >>
                        ((byte)((ulong)uVar6 + lVar12) & 0x1f) & 1) << 0x1e);
          lVar12 = lVar12 + 1;
          pVVar8 = pAig->vCis;
          uVar14 = (ulong)pVVar8->nSize;
        } while (lVar12 < (long)(uVar14 - (long)pAig->nRegs));
        uVar6 = uVar6 + (int)lVar12;
      }
      if (0 < pAig->nObjs) {
        lVar12 = 0;
        lVar13 = 0;
        do {
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar14 = *(ulong *)(&pGVar3->field_0x0 + lVar12);
          if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            *(ulong *)(&pGVar3->field_0x0 + lVar12) =
                 uVar14 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar14 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3 + lVar12) >>
                          0x1e) & ((uint)(uVar14 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3 +
                                           lVar12) >> 0x1e) & 1) << 0x1e);
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0xc;
        } while (lVar13 < pAig->nObjs);
      }
      pVVar8 = pAig->vCos;
      if (0 < pVVar8->nSize) {
        lVar12 = 0;
        do {
          iVar11 = pVVar8->pArray[lVar12];
          if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0065b5d2;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pAig->pObjs + iVar11;
          uVar9 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar9 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar9 & 0x1fffffff))) & 0x40000000);
          lVar12 = lVar12 + 1;
          pVVar8 = pAig->vCos;
        } while (lVar12 < pVVar8->nSize);
      }
      iVar11 = pAig->nRegs;
      if (0 < iVar11) {
        iVar7 = 0;
        do {
          iVar1 = pAig->vCos->nSize;
          uVar9 = (iVar1 - iVar11) + iVar7;
          if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_0065b5f1;
          iVar1 = pAig->vCos->pArray[uVar9];
          if (((long)iVar1 < 0) || (pAig->nObjs <= iVar1)) goto LAB_0065b5d2;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = pAig->vCis->nSize;
          uVar9 = (iVar2 - iVar11) + iVar7;
          if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_0065b5f1;
          iVar11 = pAig->vCis->pArray[uVar9];
          lVar12 = (long)iVar11;
          if ((lVar12 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0065b5d2;
          *(ulong *)(pGVar3 + lVar12) =
               *(ulong *)(pGVar3 + lVar12) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar1) & 0x40000000);
          iVar7 = iVar7 + 1;
          iVar11 = pAig->nRegs;
        } while (iVar7 < iVar11);
      }
      uVar9 = pAig->vCos->nSize;
      if (uVar9 - iVar11 != 0 && iVar11 <= (int)uVar9) {
        uVar5 = uVar9;
        if ((int)uVar9 < 1) {
          uVar5 = 0;
        }
        uVar14 = 0;
        do {
          if (uVar5 == uVar14) {
LAB_0065b5f1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar7 = pAig->vCos->pArray[uVar14];
          if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) {
LAB_0065b5d2:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          if ((pAig->pObjs[iVar7].field_0x3 & 0x40) != 0) {
            p->iPo = (int)uVar14;
            p->iFrame = iVar10;
            p->nBits = uVar6;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar9 - iVar11 != uVar14);
      }
      bVar4 = iVar10 < p->iFrame;
      iVar10 = iVar10 + 1;
    } while (bVar4);
  }
  Gia_ManCleanMark0(pAig);
  return p->iPo;
}

Assistant:

int Gia_ManSetFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    p->iPo = -1;
//    Gia_ManForEachRo( pAig, pObj, i )
//       pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        // check the POs
        Gia_ManForEachPo( pAig, pObj, k )
	    {
            if ( !pObj->fMark0 )
                continue;
            p->iPo = k;
            p->iFrame = i;
            p->nBits = iBit;
            break;
	    }
    }
    Gia_ManCleanMark0(pAig);
    return p->iPo;
}